

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

ostream * lambda::operator<<(std::ostream&,lambda::Ast_const&)::helper::rec(std::ostream&,lambda::
          Ast_const&,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::
          allocator<std::basic_string_view<char,std::char_traits<char>_>_>_>__
                    (ostream *os,Ast *ast,Context *ctxt)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  anon_class_16_2_514ea2a2 local_60;
  anon_class_16_2_514ea2a2 local_50;
  anon_class_8_1_3fcf66a2 local_40;
  anon_class_16_2_514ea2a2 local_38;
  ublib local_28 [8];
  Context *local_20;
  Context *ctxt_local;
  Ast *ast_local;
  ostream *os_local;
  
  local_20 = ctxt;
  ctxt_local = (Context *)ast;
  ast_local = (Ast *)os;
  ublib::match<lambda::Ast_const&>(local_28,ast);
  local_38.os = (ostream *)ast_local;
  local_38.ctxt = local_20;
  local_40.os = (ostream *)ast_local;
  local_50.os = (ostream *)ast_local;
  local_50.ctxt = local_20;
  local_60.os = (ostream *)ast_local;
  local_60.ctxt = local_20;
  pbVar1 = ublib::impl::Matcher<lambda::Ast_const&>::operator<<
                     ((Matcher<lambda::Ast_const&> *)local_28,&local_38,&local_40,&local_50,
                      &local_60);
  return pbVar1;
}

Assistant:

static std::ostream& rec(std::ostream& os, Ast const& ast, Context& ctxt) {
      return ublib::match(ast)(
          [&](Ast::Variable const& e) -> std::ostream& {
            return os << ctxt.at(e.index()) << '_' << e.index();
          },
          [&](Ast::Free_variable const& e) -> std::ostream& { return os << e.name(); },
          [&](Ast::Call const& e) -> std::ostream& {
            rec(os, e.callee(), ctxt);
            os << ' ';
            return rec(os, e.argument(), ctxt);
          },
          [&](Ast::Lambda const& e) -> std::ostream& {
            os << "(/" << e.variable() << '.';
            ctxt.push_back(e.variable());
            rec(os, e.expression(), ctxt);
            ctxt.pop_back();
            return os << ')';
          });
    }